

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::getHelpText_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view overview)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  v9 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  basic_string_view<char,_std::char_traits<char>_> local_670;
  size_type local_660;
  size_t index;
  string_view desc;
  char *local_640;
  basic_string_view<char> local_638;
  string local_628;
  type *local_608;
  type *key_1;
  type *opt_1;
  __normal_iterator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_5f0;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  basic_string_view<char,_std::char_traits<char>_> local_5c8;
  basic_string_view<char> local_5b8;
  undefined1 local_5a8 [8];
  string indent;
  unsigned_long local_580;
  string *local_578;
  string *val;
  string key;
  shared_ptr<slang::CommandLine::Option> *opt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
  *__range1;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lines;
  size_t maxLen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  char *local_4f8;
  string local_4f0;
  basic_string_view<char,_std::char_traits<char>_> local_4d0;
  basic_string_view<char> local_4c0;
  string local_4b0;
  basic_string_view<char,_std::char_traits<char>_> local_480;
  basic_string_view<char> local_470;
  string local_460;
  byte local_439;
  CommandLine *local_438;
  CommandLine *this_local;
  string_view overview_local;
  string *result;
  undefined1 local_408 [16];
  v9 *local_3f8;
  char *local_3f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_3e8;
  v9 *local_3e0;
  char *pcStack_3d8;
  string *local_3d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3c8 [2];
  undefined1 local_3b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  char *local_3a0;
  string *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  char *pcStack_388;
  string *local_380;
  v9 *local_378;
  char *local_370;
  basic_string_view<char,_std::char_traits<char>_> *local_368;
  basic_string_view<char> *local_360;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_358 [2];
  undefined1 local_348 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  char *local_330;
  string *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  char *pcStack_318;
  string *local_310;
  size_t local_308;
  char *local_300;
  basic_string_view<char,_std::char_traits<char>_> *local_2f8;
  basic_string_view<char> *local_2f0;
  char *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_2e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  local_2d8;
  undefined1 local_2b0 [16];
  v9 *local_2a0;
  char *local_298;
  pointer *local_290;
  v9 *local_288;
  v9 *local_280;
  char *pcStack_278;
  undefined1 *local_270;
  size_t local_268;
  char *local_260;
  basic_string_view<char,_std::char_traits<char>_> *local_258;
  basic_string_view<char> *local_250;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_248;
  undefined1 local_228 [16];
  v9 *local_218;
  char *local_210;
  pointer *local_208;
  type *local_200;
  v9 *local_1f8;
  char *pcStack_1f0;
  string *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char **local_1d0;
  basic_string_view<char> *local_1c8;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1b8;
  v9 **local_1b0;
  string **local_190;
  undefined1 *local_188;
  string **local_180;
  undefined8 local_178;
  undefined1 *local_170;
  string **local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  char *pcStack_150;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_148;
  undefined1 *local_140;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_138;
  undefined8 local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_120;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_118;
  undefined1 *local_110;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_c0;
  char *local_b8;
  v9 **local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_88;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  basic_string_view<char,_std::char_traits<char>_> *local_68;
  v9 **local_60;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  char **local_10;
  
  overview_local._M_len = (size_t)overview._M_str;
  this_local = (CommandLine *)overview._M_len;
  local_439 = 0;
  local_438 = this;
  overview_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar1) {
    local_480 = sv("OVERVIEW: {}\n\n",0xe);
    local_360 = &local_470;
    local_368 = &local_480;
    local_378 = (v9 *)local_480._M_len;
    local_370 = local_480._M_str;
    this_00 = (v9 *)local_480._M_len;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>(local_360,local_480)
    ;
    local_e8 = local_368;
    local_3d0 = &local_460;
    local_3e0 = (v9 *)local_470.data_;
    pcStack_3d8 = (char *)local_470.size_;
    local_3e8 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&this_local;
    local_1b0 = &local_3e0;
    local_3f8 = (v9 *)local_470.data_;
    local_3f0 = (char *)local_470.size_;
    result = (string *)
             ::fmt::v9::
             make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                       (local_3e8,this_00,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_3d0);
    local_188 = local_408;
    local_190 = &result;
    local_178 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_3f0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_190;
    local_180 = local_190;
    local_170 = local_188;
    local_168 = local_190;
    ::fmt::v9::vformat_abi_cxx11_(&local_460,local_3f8,fmt,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
  }
  local_4d0 = sv("USAGE: {} [options]",0x13);
  local_2f0 = &local_4c0;
  local_2f8 = &local_4d0;
  local_308 = local_4d0._M_len;
  local_300 = local_4d0._M_str;
  ::fmt::v9::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>(local_2f0,local_4d0);
  local_c0 = local_2f8;
  local_328 = &this->programName;
  local_310 = &local_4b0;
  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0.data_;
  pcStack_318 = (char *)local_4c0.size_;
  local_e0 = &local_320;
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0.data_;
  local_330 = (char *)local_4c0.size_;
  local_358[0] = ::fmt::v9::
                 make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string_const&>
                           ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_328,(v9 *)local_310,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4c0.data_);
  local_140 = local_348;
  local_148 = local_358;
  local_130 = 0xd;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = local_330;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_148;
  local_138 = local_148;
  local_128 = local_140;
  local_120 = local_148;
  ::fmt::v9::vformat_abi_cxx11_(&local_4b0,(v9 *)local_338,fmt_00,args_00);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    local_2e0 = &local_500;
    local_2e8 = " {}...";
    local_1c0 = " {}...";
    local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e02b7;
    local_1b8 = local_2e0;
    local_4f8 = (char *)std::char_traits<char>::length(" {}...");
    local_b8 = local_2e8;
    peVar2 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_398 = &peVar2->valueName;
    local_380 = &local_4f0;
    local_390 = local_500;
    pcStack_388 = local_4f8;
    local_160 = &local_390;
    local_3a8 = local_500;
    local_3a0 = local_4f8;
    local_158 = local_3a8;
    pcStack_150 = local_3a0;
    local_3c8[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_398,(v9 *)local_380,local_500);
    local_110 = local_3b8;
    local_118 = local_3c8;
    local_100 = 0xd;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = local_3a0;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_118;
    local_108 = local_118;
    local_f8 = local_110;
    local_f0 = local_118;
    ::fmt::v9::vformat_abi_cxx11_(&local_4f0,(v9 *)local_3a8,fmt_01,args_01);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
  }
  _maxLen = sv("\n\nOPTIONS:\n",0xb);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&maxLen);
  lines.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
           ::begin(&this->orderedOptions);
  opt = (shared_ptr<slang::CommandLine::Option> *)
        std::
        vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
        ::end(&this->orderedOptions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<slang::CommandLine::Option>_*,_std::vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>_>
                                     *)&opt), bVar1) {
    key.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<slang::CommandLine::Option>_*,_std::vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>_>
         ::operator*(&__end1);
    peVar2 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key.field_2._8_8_);
    std::__cxx11::string::string((string *)&val,(string *)&peVar2->allArgNames);
    peVar2 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key.field_2._8_8_);
    local_578 = (string *)&peVar2->valueName;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_578);
      if (*pcVar3 != '=') {
        std::__cxx11::string::operator+=((string *)&val,' ');
      }
      std::__cxx11::string::operator+=((string *)&val,local_578);
    }
    local_580 = std::__cxx11::string::length();
    puVar4 = std::max<unsigned_long>
                       ((unsigned_long *)
                        &lines.
                         super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_580);
    lines.
    super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar4;
    indent.field_2._8_8_ =
         (size_type)
         std::__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>::get
                   (key.field_2._8_8_);
    std::
    vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
    ::emplace_back<slang::CommandLine::Option*,std::__cxx11::string>
              ((vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
                *)&__range1,(Option **)((long)&indent.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val);
    std::__cxx11::string::~string((string *)&val);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<slang::CommandLine::Option>_*,_std::vector<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>_>
    ::operator++(&__end1);
  }
  lines.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)&(lines.
                         super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 2);
  local_5c8 = sv("  {:{}}",7);
  local_250 = &local_5b8;
  local_258 = &local_5c8;
  local_268 = local_5c8._M_len;
  local_260 = local_5c8._M_str;
  ::fmt::v9::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>(local_250,local_5c8);
  local_68 = local_258;
  ___range1_1 = sv(" ",1);
  local_270 = local_5a8;
  local_280 = (v9 *)local_5b8.data_;
  pcStack_278 = (char *)local_5b8.size_;
  local_288 = (v9 *)&__range1_1;
  local_290 = &lines.
               super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0 = &local_280;
  local_2a0 = (v9 *)local_5b8.data_;
  local_298 = (char *)local_5b8.size_;
  ::fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&>
            (&local_2d8,local_288,(basic_string_view<char,_std::char_traits<char>_> *)local_290,
             (unsigned_long *)local_5b8.data_);
  local_90 = local_2b0;
  local_98 = &local_2d8;
  local_78 = 0x4d;
  fmt_02.size_ = 0x4d;
  fmt_02.data_ = local_298;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)local_98;
  local_88 = local_98;
  local_80 = local_98;
  local_70 = local_90;
  ::fmt::v9::vformat_abi_cxx11_((string *)local_5a8,local_2a0,fmt_02,args_02);
  __end1_1 = std::
             vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range1);
  local_5f0._M_current =
       (pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&local_5f0);
    if (!bVar1) break;
    opt_1 = &__gnu_cxx::
             __normal_iterator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end1_1)->first;
    key_1 = (type *)std::get<0ul,slang::CommandLine::Option*,std::__cxx11::string>
                              ((pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)opt_1);
    local_608 = std::get<1ul,slang::CommandLine::Option*,std::__cxx11::string>
                          ((pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)opt_1);
    join_0x00000010_0x00000000_ = sv("  {:{}}",7);
    local_1c8 = &local_638;
    local_1d0 = &desc._M_str;
    local_1e0 = desc._M_str;
    local_1d8 = local_640;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              (local_1c8,join_0x00000010_0x00000000_);
    local_10 = local_1d0;
    local_1e8 = &local_628;
    local_1f8 = (v9 *)local_638.data_;
    pcStack_1f0 = (char *)local_638.size_;
    local_200 = local_608;
    local_208 = &lines.
                 super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60 = &local_1f8;
    local_218 = (v9 *)local_638.data_;
    local_210 = (char *)local_638.size_;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,unsigned_long&>
              (&local_248,(v9 *)local_608,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               (unsigned_long *)local_638.data_);
    local_38 = local_228;
    local_40 = &local_248;
    local_20 = 0x4d;
    fmt_03.size_ = 0x4d;
    fmt_03.data_ = local_210;
    args_03.field_1.values_ = in_R9.values_;
    args_03.desc_ = (unsigned_long_long)local_40;
    local_30 = local_40;
    local_28 = local_40;
    local_18 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(&local_628,local_218,fmt_03,args_03);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      bVar6 = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(*(long *)key_1 + 0x28));
      while( true ) {
        desc._M_len = (size_t)bVar6._M_str;
        index = bVar6._M_len;
        local_660 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)&index,'\n',0);
        if (local_660 == 0xffffffffffffffff) break;
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&index,0,
                           local_660 + 1);
        local_670 = bVar6;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_670);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_5a8);
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&index,local_660 + 1,
                           0xffffffffffffffff);
      }
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&index);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    __gnu_cxx::
    __normal_iterator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  local_439 = 1;
  std::__cxx11::string::~string((string *)local_5a8);
  std::
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range1);
  if ((local_439 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::getHelpText(string_view overview) const {
    std::string result;
    if (!overview.empty())
        result = fmt::format("OVERVIEW: {}\n\n"sv, overview);

    result += fmt::format("USAGE: {} [options]"sv, programName);
    if (positional)
        result += fmt::format(" {}...", positional->valueName);

    result += "\n\nOPTIONS:\n"sv;

    // For each option group that takes a value, tack on the value name.
    // Then compute the maximum length of any particular group's key.
    size_t maxLen = 0;
    std::vector<std::pair<Option*, std::string>> lines;
    for (auto& opt : orderedOptions) {
        std::string key = opt->allArgNames;
        std::string& val = opt->valueName;
        if (!val.empty()) {
            if (val[0] != '=')
                key += ' ';
            key += val;
        }

        maxLen = std::max(maxLen, key.length());
        lines.emplace_back(opt.get(), std::move(key));
    }

    // Add two spaces so that the description text is offset from the longest option name.
    maxLen += 2;

    // Finally append all groups to the output.
    std::string indent = fmt::format("  {:{}}"sv, " "sv, maxLen);
    for (auto& [opt, key] : lines) {
        result += fmt::format("  {:{}}"sv, key, maxLen);
        if (!opt->desc.empty()) {
            string_view desc = opt->desc;
            while (true) {
                size_t index = desc.find_first_of('\n');
                if (index == string_view::npos) {
                    result += desc;
                    break;
                }

                result += desc.substr(0, index + 1);
                result += indent;
                desc = desc.substr(index + 1);
            }
        }
        result += "\n";
    }

    return result;
}